

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *pNtk,Vec_Ptr_t *vOrder)

{
  char *pcVar1;
  long *plVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  long *plVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *p;
  size_t sVar9;
  char *pcVar10;
  Vec_Ptr_t *pVVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int gFanins [16];
  int local_78 [18];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                  ,0x155,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                  ,0x156,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(0x8000);
  pcVar1 = pNtk->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar1);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar1);
  }
  p->pName = pcVar10;
  pcVar1 = pNtk->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar1);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar1);
  }
  p->pSpec = pcVar10;
  Gia_ManHashAlloc(p);
  pVVar11 = pNtk->vPis;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      plVar2 = (long *)pVVar11->pArray[lVar14];
      pGVar12 = Gia_ManAppendObj(p);
      uVar17 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar17 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar17 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p->pObjs;
      if ((pGVar12 < pGVar3) || (pGVar3 + p->nObjs <= pGVar12)) {
LAB_001d92fa:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p->pObjs;
      if ((pGVar12 < pGVar3) || (pGVar3 + p->nObjs <= pGVar12)) goto LAB_001d92fa;
      *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
              0x40) = (int)((ulong)((long)pGVar12 - (long)pGVar3) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar11 = pNtk->vPis;
    } while (lVar14 < pVVar11->nSize);
  }
  if (0 < vOrder->nSize) {
    lVar14 = 0;
    do {
      plVar2 = (long *)vOrder->pArray[lVar14];
      uVar6 = *(uint *)((long)plVar2 + 0x14) & 0xf;
      if (uVar6 == 7) {
        iVar8 = *(int *)((long)plVar2 + 0x1c);
        if (0x10 < iVar8) {
          __assert_fail("Abc_ObjFaninNum(pObj) <= 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x167,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        pcVar1 = (char *)plVar2[7];
        iVar7 = Abc_SopGetVarNum(pcVar1);
        if (iVar8 != iVar7) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x168,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        iVar8 = *(int *)((long)plVar2 + 0x1c);
        if (0 < (long)iVar8) {
          lVar19 = plVar2[4];
          lVar20 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
          lVar15 = 0;
          do {
            iVar7 = *(int *)(*(long *)(lVar20 + (long)*(int *)(lVar19 + lVar15 * 4) * 8) + 0x40);
            local_78[lVar15] = iVar7;
            if (iVar7 < 0) {
              __assert_fail("gFanins[k] >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                            ,0x16c,
                            "Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
            }
            lVar15 = lVar15 + 1;
          } while (iVar8 != lVar15);
        }
        iVar8 = Abc_NtkDeriveFlatGiaSop(p,local_78,pcVar1);
        *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
                0x40) = iVar8;
      }
      else {
        if (uVar6 != 10 && (*(uint *)((long)plVar2 + 0x14) & 0xe) != 8) {
          __assert_fail("Abc_ObjIsBox(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x171,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        lVar19 = plVar2[7];
        if (*(int *)((long)plVar2 + 0x1c) != *(int *)(*(long *)(lVar19 + 0x28) + 4)) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x174,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        if (*(int *)((long)plVar2 + 0x2c) != *(int *)(*(long *)(lVar19 + 0x30) + 4)) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x175,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        pGVar13 = *(Gia_Man_t **)(lVar19 + 0x158);
        if (*(int *)((long)plVar2 + 0x1c) != pGVar13->vCis->nSize - pGVar13->nRegs) {
          __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x182,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        if (*(int *)((long)plVar2 + 0x2c) != pGVar13->vCos->nSize - pGVar13->nRegs) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcHieCec.c"
                        ,0x183,"Gia_Man_t *Abc_NtkDeriveFlatGia2Derive(Abc_Ntk_t *, Vec_Ptr_t *)");
        }
        Gia_ManFillValue(pGVar13);
        pGVar3 = pGVar13->pObjs;
        pGVar3->Value = 0;
        iVar8 = *(int *)((long)plVar2 + 0x1c);
        if (0 < (long)iVar8) {
          lVar19 = plVar2[4];
          pVVar4 = pGVar13->vCis;
          uVar6 = pVVar4->nSize;
          uVar16 = uVar6 - pGVar13->nRegs;
          lVar20 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          uVar18 = 0;
          do {
            if (uVar17 == uVar18) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (uVar6 == uVar18) goto LAB_001d925f;
            iVar7 = pVVar4->pArray[uVar18];
            if (((long)iVar7 < 0) || (pGVar13->nObjs <= iVar7)) goto LAB_001d9240;
            plVar5 = *(long **)(lVar20 + (long)*(int *)(lVar19 + uVar18 * 4) * 8);
            pGVar3[iVar7].Value =
                 *(uint *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                    (long)*(int *)plVar5[4] * 8) + 0x40);
            uVar18 = uVar18 + 1;
          } while ((long)iVar8 != uVar18);
        }
        if (0 < pGVar13->nObjs) {
          lVar20 = 8;
          lVar19 = 0;
          while (pGVar3 = pGVar13->pObjs, pGVar3 != (Gia_Obj_t *)0x0) {
            uVar17 = *(ulong *)((long)pGVar3 + lVar20 + -8);
            if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
              uVar6 = *(uint *)((long)pGVar3 +
                               lVar20 + (ulong)(uint)((int)(uVar17 & 0x1fffffff) << 2) * -3);
              if (((int)uVar6 < 0) ||
                 (uVar16 = *(uint *)((long)pGVar3 +
                                    lVar20 + (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3),
                 (int)uVar16 < 0)) goto LAB_001d927e;
              iVar8 = Gia_ManHashAnd(p,uVar6 ^ (uint)(uVar17 >> 0x1d) & 1,
                                     uVar16 ^ (uint)(uVar17 >> 0x3d) & 1);
              *(int *)(&pGVar3->field_0x0 + lVar20) = iVar8;
            }
            lVar19 = lVar19 + 1;
            lVar20 = lVar20 + 0xc;
            if (pGVar13->nObjs <= lVar19) break;
          }
        }
        if (0 < *(int *)((long)plVar2 + 0x2c)) {
          lVar19 = 0;
          do {
            lVar20 = (long)pGVar13->vCos->nSize;
            if (lVar20 - pGVar13->nRegs <= lVar19) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if (lVar20 <= lVar19) {
LAB_001d925f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar8 = pGVar13->vCos->pArray[lVar19];
            if (((long)iVar8 < 0) || (pGVar13->nObjs <= iVar8)) {
LAB_001d9240:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar16 = (uint)*(undefined8 *)(pGVar13->pObjs + iVar8);
            uVar6 = (pGVar13->pObjs + iVar8)[-(ulong)(uVar16 & 0x1fffffff)].Value;
            if ((int)uVar6 < 0) {
LAB_001d927e:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)(plVar2[6] + lVar19 * 4) * 8);
            *(uint *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)plVar5[6] * 8) + 0x40) = uVar16 >> 0x1d & 1 ^ uVar6;
            lVar19 = lVar19 + 1;
          } while (lVar19 < *(int *)((long)plVar2 + 0x2c));
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vOrder->nSize);
  }
  pVVar11 = pNtk->vPos;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      Gia_ManAppendCo(p,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar11->pArray[lVar14] + 0x20) + 8)
                                          + (long)**(int **)((long)pVVar11->pArray[lVar14] + 0x20) *
                                            8) + 0x40));
      lVar14 = lVar14 + 1;
      pVVar11 = pNtk->vPos;
    } while (lVar14 < pVVar11->nSize);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar13 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  Abc_NtkCountAndNodes(vOrder);
  printf("%8d -> ");
  Gia_ManPrintStats(pGVar13,(Gps_Par_t *)0x0);
  return pGVar13;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2Derive( Abc_Ntk_t * pNtk, Vec_Ptr_t * vOrder )
{
    int gFanins[16];
    Abc_Ntk_t * pNtkModel;
    Gia_Man_t * pGiaBox, * pGia = NULL;
    Gia_Obj_t * pGiaObj;
    Abc_Obj_t * pTerm, * pObj;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // start the network
    pGia = Gia_ManStart( (1<<15) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            char * pSop = (char *)pObj->pData;
            assert( Abc_ObjFaninNum(pObj) <= 16 );
            assert( Abc_ObjFaninNum(pObj) == Abc_SopGetVarNum(pSop) );
            Abc_ObjForEachFanin( pObj, pTerm, k )
            {
                gFanins[k] = pTerm->iTemp;
                assert( gFanins[k] >= 0 );
            }
            Abc_ObjFanout0(pObj)->iTemp = Abc_NtkDeriveFlatGiaSop( pGia, gFanins, pSop );
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        // check the match between the number of actual and formal parameters
        assert( Abc_ObjFaninNum(pObj) == Abc_NtkPiNum(pNtkModel) );
        assert( Abc_ObjFanoutNum(pObj) == Abc_NtkPoNum(pNtkModel) );
/*
        // assign PIs
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjFanout0( Abc_NtkPi(pNtkModel, k) )->iTemp = Abc_ObjFanin0(pTerm)->iTemp;
        // call recursively
        Abc_NtkDeriveFlatGia_rec( pGia, pNtkModel );
        // assign POs
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Abc_ObjFanin0( Abc_NtkPo(pNtkModel, k) )->iTemp;
*/ 
        // duplicate the AIG
        pGiaBox = (Gia_Man_t *)pNtkModel->pData;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManPiNum(pGiaBox) );
        assert( Abc_ObjFanoutNum(pObj) == Gia_ManPoNum(pGiaBox) );
        Gia_ManFillValue( pGiaBox );
        Gia_ManConst0(pGiaBox)->Value = 0;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Gia_ManPi(pGiaBox, k)->Value = Abc_ObjFanin0(pTerm)->iTemp;
        Gia_ManForEachAnd( pGiaBox, pGiaObj, k )
            pGiaObj->Value = Gia_ManHashAnd( pGia, Gia_ObjFanin0Copy(pGiaObj), Gia_ObjFanin1Copy(pGiaObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjFanout0(pTerm)->iTemp = Gia_ObjFanin0Copy(Gia_ManPo(pGiaBox, k));
    }
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pGiaBox = pGia );
    Gia_ManStop( pGiaBox );

    printf( "%8d -> ", Abc_NtkCountAndNodes(vOrder) );
    Gia_ManPrintStats( pGia, NULL );
    return pGia;
}